

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

string * __thiscall
toml::detail::character_in_range::name_abi_cxx11_
          (string *__return_storage_ptr__,character_in_range *this)

{
  int in_EDX;
  int c;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  show_char_abi_cxx11_(&local_38,(detail *)(ulong)this->from_,in_EDX);
  std::operator+(&local_98,"character_in_range{",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
  std::operator+(&local_78,&local_98,",");
  show_char_abi_cxx11_(&sStack_b8,(detail *)(ulong)this->to_,c);
  std::operator+(&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,&local_58,"}");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string character_in_range::name() const
{
    return "character_in_range{" + show_char(from_) + "," + show_char(to_) + "}";
}